

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O1

void * kmemmem(void *_str,int n,void *_pat,int m,int **_prep)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  long lVar5;
  int *__ptr;
  int *__ptr_00;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  size_t __nmemb;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  
  if ((_prep == (int **)0x0) || (__ptr = *_prep, __ptr == (int *)0x0)) {
    __ptr = (int *)calloc((long)(m + 0x100),4);
    __nmemb = (size_t)m;
    lVar6 = 0;
    do {
      __ptr[__nmemb + lVar6] = m;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
    uVar1 = m - 1;
    uVar11 = (ulong)uVar1;
    uVar13 = (ulong)uVar1;
    pbVar7 = (byte *)_pat;
    uVar8 = uVar13;
    if (1 < m) {
      do {
        __ptr[__nmemb + *pbVar7] = (int)uVar8;
        uVar8 = uVar8 - 1;
        pbVar7 = pbVar7 + 1;
      } while (uVar8 != 0);
    }
    __ptr_00 = (int *)calloc(__nmemb,4);
    __ptr_00[(int)uVar1] = m;
    if (1 < m) {
      uVar9 = (ulong)(int)(m - 2U);
      uVar16 = 0;
      iVar12 = 1;
      uVar8 = (ulong)(m - 2U);
      do {
        iVar15 = (int)uVar11;
        uVar17 = (ulong)iVar15;
        iVar14 = (int)uVar8;
        if (((long)uVar8 <= (long)uVar17) ||
           (iVar18 = __ptr_00[(int)(~(uint)uVar16 + iVar14 + m)], iVar14 - iVar15 <= iVar18)) {
          if (iVar14 < iVar15) {
            uVar11 = uVar8 & 0xffffffff;
          }
          if (-1 < (int)uVar11) {
            if ((long)uVar9 < (long)uVar17) {
              uVar17 = uVar9;
            }
            do {
              if (*(char *)((long)_pat + uVar17) !=
                  *(char *)((long)_pat + (long)(iVar12 + (int)uVar17))) {
                uVar11 = uVar17 & 0xffffffff;
                goto LAB_00141c93;
              }
              bVar4 = 0 < (long)uVar17;
              uVar17 = uVar17 - 1;
            } while (bVar4);
            uVar11 = 0xffffffff;
          }
LAB_00141c93:
          iVar18 = iVar14 - (int)uVar11;
          uVar16 = uVar8 & 0xffffffff;
        }
        __ptr_00[uVar8] = iVar18;
        uVar9 = uVar9 - 1;
        iVar12 = iVar12 + 1;
        bVar4 = 0 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar4);
    }
    if (0 < m) {
      uVar8 = 0;
      do {
        __ptr[uVar8] = m;
        uVar8 = uVar8 + 1;
      } while ((uint)m != uVar8);
      if (0 < m) {
        uVar11 = 0;
        iVar12 = 0;
        uVar8 = uVar13;
        do {
          if (uVar8 + 1 == (ulong)(uint)__ptr_00[uVar8]) {
            uVar9 = (ulong)iVar12;
            if ((long)uVar9 < (long)(uVar13 - uVar8)) {
              do {
                if (__ptr[uVar9] == m) {
                  __ptr[uVar9] = (int)(uVar13 - uVar8);
                }
                uVar9 = uVar9 + 1;
              } while (uVar11 != uVar9);
              iVar12 = (int)uVar9;
            }
          }
          uVar8 = uVar8 - 1;
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uint)m);
      }
    }
    piVar10 = __ptr_00;
    if (1 < m) {
      do {
        __ptr[(long)(int)uVar1 - (long)*piVar10] = (int)uVar13;
        uVar13 = uVar13 - 1;
        piVar10 = piVar10 + 1;
      } while (uVar13 != 0);
    }
    free(__ptr_00);
  }
  if ((_prep != (int **)0x0) && (*_prep == (int *)0x0)) {
    *_prep = __ptr;
  }
  if (-1 < n - m) {
    iVar12 = 0;
    do {
      iVar15 = 1;
      lVar6 = (long)m;
      do {
        if (lVar6 < 1) {
          return (void *)((long)_str + (long)iVar12);
        }
        lVar2 = lVar6 + -1;
        bVar3 = *(byte *)((long)_str + lVar6 + (long)iVar12 + -1);
        iVar15 = iVar15 + -1;
        lVar5 = lVar6 + -1;
        lVar6 = lVar2;
      } while (*(byte *)((long)_pat + lVar5) == bVar3);
      iVar14 = iVar15 + __ptr[(long)m + (ulong)bVar3];
      if (iVar15 + __ptr[(long)m + (ulong)bVar3] <= __ptr[lVar2]) {
        iVar14 = __ptr[lVar2];
      }
      iVar12 = iVar12 + iVar14;
    } while (iVar12 <= n - m);
  }
  if (_prep == (int **)0x0) {
    free(__ptr);
  }
  return (void *)0x0;
}

Assistant:

void *kmemmem(const void *_str, int n, const void *_pat, int m, int **_prep)
{
	int i, j, *prep = 0, *bmGs, *bmBc;
	const ubyte_t *str, *pat;
	str = (const ubyte_t*)_str; pat = (const ubyte_t*)_pat;
	prep = (_prep == 0 || *_prep == 0)? ksBM_prep(pat, m) : *_prep;
	if (_prep && *_prep == 0) *_prep = prep;
	bmGs = prep; bmBc = prep + m;
	j = 0;
	while (j <= n - m) {
		for (i = m - 1; i >= 0 && pat[i] == str[i+j]; --i);
		if (i >= 0) {
			int max = bmBc[str[i+j]] - m + 1 + i;
			if (max < bmGs[i]) max = bmGs[i];
			j += max;
		} else return (void*)(str + j);
	}
	if (_prep == 0) free(prep);
	return 0;
}